

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  basic_appender<char> bVar4;
  byte bVar5;
  int **ppiVar6;
  size_t sVar7;
  ulong uVar8;
  int **ppiVar9;
  uint uVar10;
  buffer<char> *buf;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char cVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  int num_zeros;
  undefined1 local_e2 [2];
  bool local_e0 [4];
  int local_dc;
  undefined1 local_d8 [16];
  int local_c8;
  int local_c4;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  format_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar17 = f->significand;
  uVar1 = 0x1f;
  if ((uVar17 | 1) != 0) {
    for (; (uVar17 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar8 = (ulong)uVar17 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8);
  iVar15 = (int)(uVar8 >> 0x20);
  local_e2[1] = '0';
  local_dc = iVar15;
  local_d8._0_4_ = uVar17;
  local_d8._4_4_ = s;
  if ((long)uVar8 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                ,0x1b6,"negative value");
  }
  lVar16 = ((uVar8 >> 0x20) + 1) - (ulong)(s == none);
  uVar1 = (specs->super_basic_specs).data_;
  local_e2[0] = '.';
  local_d8._8_8_ = out.container;
  if ((uVar1 >> 0xe & 1) != 0) {
    local_c8 = exp_upper;
    local_78 = (ulong)uVar17;
    local_e2[0] = decimal_point_impl<char>(loc);
    uVar17 = (uint)local_78;
    uVar1 = (specs->super_basic_specs).data_;
    exp_upper = local_c8;
  }
  uVar13 = local_b0._M_allocated_capacity;
  uVar12 = local_d8._8_8_;
  uVar10 = f->exponent;
  iVar18 = iVar15 + uVar10;
  iVar2 = specs->precision;
  bVar5 = (byte)uVar1 & 7;
  if (bVar5 == 1) goto LAB_001dcb56;
  if ((uVar1 & 7) != 2) {
    if (iVar18 < -3) {
LAB_001dcb56:
      iVar11 = iVar15 + uVar10 + -1;
      if ((uVar1 >> 0xd & 1) == 0) {
        uVar8 = 0;
        if (iVar15 == 1) {
          local_e2[0] = '\0';
          uVar8 = 0;
        }
      }
      else {
        uVar8 = 0;
        if (0 < iVar2 - iVar15) {
          uVar8 = (ulong)(uint)(iVar2 - iVar15);
        }
        lVar16 = lVar16 + uVar8;
      }
      iVar2 = 1 - iVar18;
      if (0 < iVar18) {
        iVar2 = iVar11;
      }
      lVar3 = 2;
      if (99 < iVar2) {
        lVar3 = (ulong)(999 < iVar2) + 3;
      }
      sVar7 = (3 - (ulong)(local_e2[0] == '\0')) + lVar16 + lVar3;
      local_c0._4_4_ = uVar17;
      local_c0._0_4_ = s;
      local_c0[0xc] = local_e2[0];
      local_c0._8_4_ = iVar15;
      local_b0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar8);
      local_b0._M_allocated_capacity._6_2_ = SUB82(uVar13,6);
      local_b0._M_allocated_capacity =
           CONCAT26(local_b0._M_allocated_capacity._6_2_,
                    CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,local_b0._M_allocated_capacity._0_5_)) |
           0x450000000000;
      local_b0._8_4_ = iVar11;
      if (specs->width < 1) {
        uVar8 = sVar7 + *(size_t *)(local_d8._8_8_ + 8);
        if (*(size_t *)(local_d8._8_8_ + 0x10) < uVar8) {
          (**(grow_fun *)(local_d8._8_8_ + 0x18))((buffer<char> *)local_d8._8_8_,uVar8);
        }
        bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
                ::anon_class_28_8_ce6b8c4d::operator()
                          ((anon_class_28_8_ce6b8c4d *)local_c0,(iterator)uVar12);
      }
      else {
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_d8._8_8_,specs,sVar7,sVar7,
                           (anon_class_28_8_ce6b8c4d *)local_c0);
      }
      return (basic_appender<char>)bVar4.container;
    }
    if (0 < iVar2) {
      exp_upper = iVar2;
    }
    if (exp_upper < iVar18) goto LAB_001dcb56;
  }
  local_c4 = iVar18;
  if (-1 < (int)uVar10) {
    lVar16 = lVar16 + (ulong)uVar10;
    local_e0 = (bool  [4])(iVar2 - iVar18);
    if ((uVar1 >> 0xd & 1) != 0) {
      lVar16 = lVar16 + 1;
      if (((int)local_e0 < 1) && (bVar5 != 2)) {
        local_e0[0] = false;
        local_e0[1] = false;
        local_e0[2] = false;
        local_e0[3] = false;
      }
      else if (0 < (int)local_e0) {
        lVar16 = lVar16 + (ulong)(uint)local_e0;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    iVar15 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar9 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar12 = local_70._M_allocated_capacity;
      do {
        if ((int **)uVar12 == ppiVar9) {
          cVar14 = *(char *)((long)ppiVar9 + -1);
          uVar12 = ppiVar9;
        }
        else {
          cVar14 = *(char *)uVar12;
          if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001dcd74;
          uVar12 = (int **)(uVar12 + 1);
        }
        iVar15 = iVar15 + cVar14;
        if (iVar18 <= iVar15) goto LAB_001dcd74;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_001dcd74:
    local_c0._0_8_ = local_d8 + 4;
    local_c0._8_8_ = local_d8;
    local_b0._M_allocated_capacity = (size_type)&local_dc;
    local_90._M_allocated_capacity = (size_type)local_e2;
    local_90._8_8_ = local_e0;
    local_80 = local_e2 + 1;
    local_b0._8_8_ = f;
    local_a0._M_p = (pointer)&local_70;
    local_98 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)local_d8._8_8_,specs,lVar16 + lVar3,lVar16 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_c0);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar12 = local_60;
    uVar13 = local_70._M_allocated_capacity;
    if ((int **)local_70._M_allocated_capacity == &local_60) {
      return (basic_appender<char>)bVar4.container;
    }
LAB_001dcf3c:
    operator_delete((void *)uVar13,uVar12 + 1);
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar18) {
    uVar10 = 0;
    local_e0 = (bool  [4])(iVar2 - iVar15 & (int)(uVar1 << 0x12) >> 0x1f);
    uVar17 = (uint)local_e0;
    if ((int)local_e0 < 1) {
      uVar17 = uVar10;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    if (local_98 != (format_specs *)0x0) {
      ppiVar6 = (int **)(local_c0._8_8_ + local_c0._0_8_);
      lVar3 = 0;
      ppiVar9 = (int **)local_c0._0_8_;
      do {
        if (ppiVar9 == ppiVar6) {
          cVar14 = *(char *)((long)ppiVar6 + -1);
          ppiVar9 = ppiVar6;
        }
        else {
          cVar14 = *(char *)ppiVar9;
          if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001dceab;
          ppiVar9 = (int **)((long)ppiVar9 + 1);
        }
        uVar10 = uVar10 + (int)cVar14;
        if (iVar18 <= (int)uVar10) goto LAB_001dceab;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_001dceab:
    sVar7 = (ulong)uVar17 + lVar16 + lVar3 + 1;
    local_70._M_allocated_capacity = (size_type)(local_d8 + 4);
    local_70._8_8_ = local_d8;
    local_60 = &local_dc;
    local_58 = &local_c4;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e2;
    local_40._M_allocated_capacity = (size_type)local_e0;
    local_40._8_8_ = local_e2 + 1;
    local_48 = (digit_grouping<char> *)local_c0;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_d8._8_8_,specs,sVar7,sVar7,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,(ulong)(local_90._M_allocated_capacity + 1));
    }
    uVar12 = local_b0._M_allocated_capacity;
    uVar13 = local_c0._0_8_;
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return (basic_appender<char>)bVar4.container;
    }
    goto LAB_001dcf3c;
  }
  iVar15 = -iVar18;
  local_70._M_allocated_capacity._0_4_ = iVar15;
  if (uVar8 >> 0x20 == 0) {
    if ((-1 < iVar2) && (SBORROW4(iVar2,iVar15) != iVar2 + iVar18 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar2;
      iVar15 = iVar2;
    }
    if (iVar15 == 0) {
      local_e0[0] = (bool)(char)((uVar1 & 0x2000) >> 0xd);
      iVar2 = 2 - (uint)((uVar1 & 0x2000) == 0);
      iVar15 = 0;
      goto LAB_001dce42;
    }
  }
  local_e0[0] = true;
  iVar2 = 2;
LAB_001dce42:
  sVar7 = lVar16 + (ulong)(uint)(iVar2 + iVar15);
  local_c0._0_8_ = local_d8 + 4;
  local_c0._8_8_ = local_e0;
  local_b0._M_allocated_capacity = (size_type)local_e2;
  local_b0._8_8_ = &local_70;
  local_a0._M_p = local_e2 + 1;
  local_98 = (format_specs *)local_d8;
  local_90._M_allocated_capacity = (size_type)&local_dc;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_d8._8_8_,specs,sVar7,sVar7,
                     (anon_class_56_7_88befd79 *)local_c0);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}